

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void __thiscall slang::SVInt::initSlowCase(SVInt *this,SVIntStorage *other)

{
  uint64_t *__dest;
  uint uVar1;
  ulong n;
  
  uVar1 = (this->super_SVIntStorage).bitWidth + 0x3f;
  n = (ulong)(((uVar1 >> 6) << ((this->super_SVIntStorage).unknownFlag & 0x1fU)) << 3);
  __dest = (uint64_t *)operator_new__(n);
  (this->super_SVIntStorage).field_0.pVal = __dest;
  if (uVar1 < 0x40) {
    return;
  }
  memmove(__dest,(other->field_0).pVal,n);
  return;
}

Assistant:

void SVInt::initSlowCase(const SVIntStorage& other) {
    uint32_t words = getNumWords();
    pVal = new uint64_t[words];
    std::ranges::copy(other.pVal, other.pVal + words, pVal);
}